

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_fx_leq(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  operand local_108;
  operation local_104 [2];
  operand local_fc [2];
  operation local_f4 [2];
  operand local_ec;
  operation local_e8 [2];
  operand local_e0 [2];
  operation local_d8 [2];
  operand local_d0 [2];
  operation local_c8 [3];
  operand local_bc [2];
  operation local_b4 [3];
  operand local_a8 [2];
  operation local_a0 [3];
  operand local_94 [2];
  operation local_8c;
  string local_88;
  undefined1 local_58 [8];
  string t;
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  std::__cxx11::string::string((string *)(t.field_2._M_local_buf + 8));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_58,psVar1,lab);
  psVar1 = label;
  if ((ops->safe_primitives & 1U) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_88,psVar1,lab_00);
    std::__cxx11::string::operator=((string *)(t.field_2._M_local_buf + 8),(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    local_8c = CMP;
    local_94[1] = 0x14;
    local_94[0] = NUMBER;
    local_a0[2] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_8c,local_94 + 1,local_94,(int *)(local_a0 + 2));
    local_a0[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_a0 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&t.field_2 + 8));
    local_a0[0] = TEST;
    local_a8[1] = 0xb;
    local_a8[0] = NUMBER;
    local_b4[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_a0,local_a8 + 1,local_a8,(int *)(local_b4 + 2));
    local_b4[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_b4 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&t.field_2 + 8));
    local_b4[0] = TEST;
    local_bc[1] = 0xc;
    local_bc[0] = NUMBER;
    local_c8[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_b4,local_bc + 1,local_bc,(int *)(local_c8 + 2));
    local_c8[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_c8 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&t.field_2 + 8));
  }
  local_c8[0] = CMP;
  local_d0[1] = 0xb;
  local_d0[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_c8,local_d0 + 1,local_d0);
  local_d8[1] = 0x3a;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_d8 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  local_d8[0] = MOV;
  local_e0[1] = 9;
  local_e0[0] = NUMBER;
  local_e8[1] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_d8,local_e0 + 1,local_e0,(int *)(local_e8 + 1));
  local_e8[0] = JMP;
  local_ec = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_e8,&local_ec);
  local_f4[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_f4 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  local_f4[0] = MOV;
  local_fc[1] = 9;
  local_fc[0] = NUMBER;
  local_104[1] = 0xf;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_f4,local_fc + 1,local_fc,(int *)(local_104 + 1));
  local_104[0] = JMP;
  local_108 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_104,&local_108);
  if ((ops->safe_primitives & 1U) != 0) {
    error_label(code,(string *)((long)&t.field_2 + 8),re_fx_leq_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(t.field_2._M_local_buf + 8));
  return;
}

Assistant:

void compile_fx_leq(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string t = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNES, error);
    code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::CMP, asmcode::RCX, asmcode::RDX);
  code.add(asmcode::JLES, t);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, bool_f);
  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, t);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, bool_t);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_fx_leq_contract_violation);
    }
  }